

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O1

unsigned_long mbedtls_timing_get_timer(mbedtls_timing_hr_time *val,int reset)

{
  unsigned_long uVar1;
  timeval now;
  timeval local_20;
  
  if (reset == 0) {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    uVar1 = (local_20.tv_usec - *(long *)(val->opaque + 8)) / 1000 +
            (local_20.tv_sec - *(long *)val->opaque) * 1000;
  }
  else {
    uVar1 = 0;
    gettimeofday((timeval *)val,(__timezone_ptr_t)0x0);
  }
  return uVar1;
}

Assistant:

unsigned long mbedtls_timing_get_timer( struct mbedtls_timing_hr_time *val, int reset )
{
    struct _hr_time *t = (struct _hr_time *) val;

    if( reset )
    {
        gettimeofday( &t->start, NULL );
        return( 0 );
    }
    else
    {
        unsigned long delta;
        struct timeval now;
        gettimeofday( &now, NULL );
        delta = ( now.tv_sec  - t->start.tv_sec  ) * 1000ul
              + ( now.tv_usec - t->start.tv_usec ) / 1000;
        return( delta );
    }
}